

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::filterContents(QPDFPageObjectHelper *this,TokenFilter *filter,Pipeline *next)

{
  bool bVar1;
  undefined1 local_60 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  Pipeline *next_local;
  TokenFilter *filter_local;
  QPDFPageObjectHelper *this_local;
  
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)next;
  next_local = (Pipeline *)filter;
  filter_local = (TokenFilter *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)(local_60 + 0x10));
    QPDFObjectHandle::filterAsContents
              ((QPDFObjectHandle *)(local_60 + 0x10),(TokenFilter *)next_local,
               (Pipeline *)local_20._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_60 + 0x10));
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_60);
    QPDFObjectHandle::filterPageContents
              ((QPDFObjectHandle *)local_60,(TokenFilter *)next_local,(Pipeline *)local_20._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::filterContents(QPDFObjectHandle::TokenFilter* filter, Pipeline* next)
{
    if (oh().isFormXObject()) {
        oh().filterAsContents(filter, next);
    } else {
        oh().filterPageContents(filter, next);
    }
}